

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O0

RefcountedRep * absl::crc_internal::CrcCordState::RefSharedEmptyRep(void)

{
  bool bVar1;
  int iVar2;
  RefcountedRep *pRVar3;
  memory_order __b;
  
  if ((RefSharedEmptyRep()::empty == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RefSharedEmptyRep()::empty), iVar2 != 0)) {
    NoDestructor<absl::crc_internal::CrcCordState::RefcountedRep>::NoDestructor<0>
              (&RefSharedEmptyRep::empty);
    __cxa_guard_release(&RefSharedEmptyRep()::empty);
  }
  pRVar3 = NoDestructor<absl::crc_internal::CrcCordState::RefcountedRep>::operator->
                     (&RefSharedEmptyRep::empty);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if ((pRVar3->count).super___atomic_base<int>._M_i < 1) {
    __assert_fail("empty->count.load(std::memory_order_relaxed) >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/crc/internal/crc_cord_state.cc"
                  ,0x1e,
                  "static CrcCordState::RefcountedRep *absl::crc_internal::CrcCordState::RefSharedEmptyRep()"
                 );
  }
  pRVar3 = NoDestructor<absl::crc_internal::CrcCordState::RefcountedRep>::operator->
                     (&RefSharedEmptyRep::empty);
  if ((pRVar3->rep).removed_prefix.length != 0) {
    __assert_fail("empty->rep.removed_prefix.length == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/crc/internal/crc_cord_state.cc"
                  ,0x1f,
                  "static CrcCordState::RefcountedRep *absl::crc_internal::CrcCordState::RefSharedEmptyRep()"
                 );
  }
  pRVar3 = NoDestructor<absl::crc_internal::CrcCordState::RefcountedRep>::operator->
                     (&RefSharedEmptyRep::empty);
  bVar1 = std::
          deque<absl::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::crc_internal::CrcCordState::PrefixCrc>_>
          ::empty(&(pRVar3->rep).prefix_crc);
  if (bVar1) {
    pRVar3 = NoDestructor<absl::crc_internal::CrcCordState::RefcountedRep>::get
                       (&RefSharedEmptyRep::empty);
    Ref(pRVar3);
    pRVar3 = NoDestructor<absl::crc_internal::CrcCordState::RefcountedRep>::get
                       (&RefSharedEmptyRep::empty);
    return pRVar3;
  }
  __assert_fail("empty->rep.prefix_crc.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/crc/internal/crc_cord_state.cc"
                ,0x20,
                "static CrcCordState::RefcountedRep *absl::crc_internal::CrcCordState::RefSharedEmptyRep()"
               );
}

Assistant:

CrcCordState::RefcountedRep* CrcCordState::RefSharedEmptyRep() {
  static absl::NoDestructor<CrcCordState::RefcountedRep> empty;

  assert(empty->count.load(std::memory_order_relaxed) >= 1);
  assert(empty->rep.removed_prefix.length == 0);
  assert(empty->rep.prefix_crc.empty());

  Ref(empty.get());
  return empty.get();
}